

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::IMLE(IMLE *this,int d,int D,string *filename,int pre_alloc)

{
  undefined1 uVar1;
  int in_EDX;
  int in_ESI;
  IMLE *in_RDI;
  uint in_R8D;
  string *in_stack_00000130;
  IMLE *in_stack_00000138;
  string *in_stack_fffffffffffffe58;
  allocator *msg;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffe70;
  XZ *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined8 in_stack_fffffffffffffea8;
  ArrayZZ *__lhs;
  Param *in_stack_fffffffffffffeb0;
  string local_78 [39];
  allocator local_51;
  string local_50 [52];
  uint local_1c;
  
  in_RDI->d = in_ESI;
  in_RDI->D = in_EDX;
  local_1c = in_R8D;
  Param::Param(in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               (int)in_stack_fffffffffffffea8);
  Eigen::aligned_allocator_indirection<FastLinearExpert>::aligned_allocator_indirection
            ((aligned_allocator_indirection<FastLinearExpert> *)0x2f7a42);
  std::vector<FastLinearExpert,_Eigen::aligned_allocator<FastLinearExpert>_>::vector
            ((vector<FastLinearExpert,_Eigen::aligned_allocator<FastLinearExpert>_> *)
             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (allocator_type *)in_stack_fffffffffffffe58);
  Eigen::aligned_allocator_indirection<FastLinearExpert>::~aligned_allocator_indirection
            ((aligned_allocator_indirection<FastLinearExpert> *)0x2f7a68);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe70);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2f7ae0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_fffffffffffffe70);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)0x2f7bb2);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)0x2f7bd0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2f7bee);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)0x2f7c0c);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)0x2f7c2a);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)0x2f7c48);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)0x2f7c66);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2f7c84);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)0x2f7ca2);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_fffffffffffffe70);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)0x2f7d29);
  __lhs = &in_RDI->invPredictionsVar;
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)0x2f7d44);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &in_RDI->invPredictionsWeight;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2f7d5f);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe70);
  this_00 = &in_RDI->zeroXZ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(this_00);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(this_00);
  init(in_RDI,(EVP_PKEY_CTX *)(ulong)local_1c);
  reset((IMLE *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  uVar1 = load(in_stack_00000138,in_stack_00000130);
  if ((bool)uVar1) {
    std::operator+((char *)__lhs,__rhs);
    message((IMLE *)CONCAT17(uVar1,in_stack_fffffffffffffe60),in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_78);
  }
  else {
    msg = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"IMLE: Using default parameters.",msg);
    message((IMLE *)CONCAT17(uVar1,in_stack_fffffffffffffe60),(string *)msg);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return;
}

Assistant:

IMLE_base::IMLE(std::string const &filename, int pre_alloc)
#endif
{
    init( pre_alloc );
    reset();

	if( !load(filename) )
	    message(USNG_DEF_PRM);
    else
        message("Loaded " + filename);
}